

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeArrayType(Builder *this,Id element,Id sizeId,int stride)

{
  key_type kVar1;
  Id IVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppIVar5;
  Instruction *this_00;
  mapped_type_conflict *pmVar6;
  Id local_50;
  Id local_4c;
  Id debugResultId;
  key_type local_40 [4];
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Id local_20;
  int stride_local;
  Id sizeId_local;
  Id element_local;
  Builder *this_local;
  
  type._4_4_ = stride;
  local_20 = sizeId;
  stride_local = element;
  _sizeId_local = this;
  if (stride == 0) {
    local_40[3] = 0;
    while( true ) {
      kVar1 = local_40[3];
      local_40[2] = 0x1c;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_40 + 2);
      sVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar3);
      if ((int)sVar4 <= (int)kVar1) break;
      local_40[1] = 0x1c;
      pmVar3 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedTypes,local_40 + 1);
      ppIVar5 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                          (pmVar3,(long)(int)local_40[3]);
      pIStack_30 = *ppIVar5;
      IVar2 = spv::Instruction::getIdOperand(pIStack_30,0);
      if ((IVar2 == stride_local) &&
         (IVar2 = spv::Instruction::getIdOperand(pIStack_30,1), IVar2 == local_20)) {
        IVar2 = spv::Instruction::getResultId(pIStack_30);
        return IVar2;
      }
      local_40[3] = local_40[3] + 1;
    }
  }
  this_00 = (Instruction *)::operator_new(0x60);
  IVar2 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar2,0,OpTypeArray);
  pIStack_30 = this_00;
  spv::Instruction::reserveOperands(this_00,2);
  spv::Instruction::addIdOperand(pIStack_30,stride_local);
  spv::Instruction::addIdOperand(pIStack_30,local_20);
  local_40[0] = 0x1c;
  pmVar3 = std::
           unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
           ::operator[](&this->groupedTypes,local_40);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
            (pmVar3,&stack0xffffffffffffffd0);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)
             &stack0xffffffffffffffb8,pIStack_30);
  std::
  vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
  ::push_back(&this->constantsTypesGlobals,(value_type *)&stack0xffffffffffffffb8);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
            ((unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)
             &stack0xffffffffffffffb8);
  Module::mapInstruction(&this->module,pIStack_30);
  if ((this->emitNonSemanticShaderDebugInfo & 1U) != 0) {
    IVar2 = makeArrayDebugType(this,stride_local,local_20);
    local_4c = IVar2;
    local_50 = spv::Instruction::getResultId(pIStack_30);
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this->debugId,&local_50);
    *pmVar6 = IVar2;
  }
  IVar2 = spv::Instruction::getResultId(pIStack_30);
  return IVar2;
}

Assistant:

Id Builder::makeArrayType(Id element, Id sizeId, int stride)
{
    Instruction* type;
    if (stride == 0) {
        // try to find existing type
        for (int t = 0; t < (int)groupedTypes[OpTypeArray].size(); ++t) {
            type = groupedTypes[OpTypeArray][t];
            if (type->getIdOperand(0) == element &&
                type->getIdOperand(1) == sizeId)
                return type->getResultId();
        }
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeArray);
    type->reserveOperands(2);
    type->addIdOperand(element);
    type->addIdOperand(sizeId);
    groupedTypes[OpTypeArray].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        auto const debugResultId = makeArrayDebugType(element, sizeId);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}